

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templates.h
# Opt level: O2

FActionMap *
BinarySearch<FActionMap,unsigned_int>
          (FActionMap *first,int max,offset_in_FActionMap_to_unknown keyptr,uint key)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar2 = max + -1;
  iVar4 = 0;
  while( true ) {
    if (iVar2 < iVar4) {
      return (FActionMap *)0x0;
    }
    uVar3 = (uint)(iVar2 + iVar4) >> 1;
    uVar1 = *(uint *)(first[uVar3].Name + (keyptr - 0xc));
    if (uVar1 == key) break;
    if (uVar1 < key) {
      iVar4 = uVar3 + 1;
    }
    else {
      iVar2 = uVar3 - 1;
    }
  }
  return first + uVar3;
}

Assistant:

inline
const ClassType *BinarySearch (const ClassType *first, int max,
	const KeyType ClassType::*keyptr, const KeyType key)
{
	int min = 0;
	--max;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		const ClassType *probe = &first[mid];
		const KeyType &seekey = probe->*keyptr;
		if (seekey == key)
		{
			return probe;
		}
		else if (seekey < key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}